

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O2

bool __thiscall FpgaIO::PromGetResult(FpgaIO *this,uint32_t *result,PromType type)

{
  BasePort *pBVar1;
  int iVar2;
  undefined8 in_RAX;
  nodeaddr_t nVar3;
  quadlet_t read_data;
  uint32_t local_14;
  
  local_14 = (uint32_t)((ulong)in_RAX >> 0x20);
  nVar3 = GetPromAddress(this,type,false);
  pBVar1 = (this->super_BoardIO).port;
  iVar2 = (*pBVar1->_vptr_BasePort[0x23])
                    (pBVar1,(ulong)(this->super_BoardIO).BoardId,nVar3,&local_14);
  if (SUB41(iVar2,0) != false) {
    *result = local_14;
  }
  return SUB41(iVar2,0);
}

Assistant:

bool FpgaIO::PromGetResult(uint32_t &result, PromType type)
{
    quadlet_t read_data;
    nodeaddr_t address = GetPromAddress(type, false);

    bool ret = port->ReadQuadlet(BoardId, address, read_data);
    if (ret)
        result = static_cast<uint32_t>(read_data);
    return ret;
}